

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesReader.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
aeron::archive::util::PropertiesReader::parse_value<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,PropertiesReader *this,string *v,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

T parse_value(const std::string& v, T*) {
        return boost::lexical_cast<T>(v);
    }